

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs.c
# Opt level: O0

LispPTR UFS_directorynamep(LispPTR *args)

{
  int iVar1;
  LispPTR *pLVar2;
  LispPTR *pLVar3;
  DLword *pDVar4;
  int *piVar5;
  size_t x;
  bool bVar6;
  LispPTR local_2138;
  ulong local_2130;
  size_t lf_i_1;
  char *lf_dptr_1;
  char *lf_sptr_1;
  LispPTR *lf_naddress;
  size_t lf_ii;
  size_t lf_i;
  char *lf_dptr;
  char *lf_sptr;
  size_t lf_length;
  short *lf_sbase;
  char *lf_dp;
  char *lf_base;
  OneDArray *lf_arrayp_1;
  OneDArray *lf_arrayp;
  stat sbuf;
  char *base;
  long lStack_2020;
  int rval;
  size_t len;
  char fullname [4096];
  char dirname [4096];
  LispPTR *args_local;
  
  iVar1 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar1 == 0) {
    Lisp_errno = (int *)NativeAligned4FromLAddr(args[2]);
    pLVar2 = NativeAligned4FromLAddr(*args);
    if (*(char *)((long)pLVar2 + 6) == 'C') {
      lStack_2020 = (long)(int)pLVar2[2];
    }
    else if (*(char *)((long)pLVar2 + 6) == 'D') {
      lStack_2020 = (long)(int)(pLVar2[2] << 1);
    }
    else {
      error("LispStringLength: Not a character array.\n");
    }
    if (lStack_2020 + 1U < 0xfff) {
      pLVar2 = NativeAligned4FromLAddr(*args);
      if ((int)pLVar2[2] < 0x1000) {
        local_2138 = pLVar2[2];
      }
      else {
        local_2138 = 0x1000;
      }
      pLVar3 = (LispPTR *)(long)(int)local_2138;
      if (*(char *)((long)pLVar2 + 6) == 'C') {
        pDVar4 = NativeAligned2FromLAddr(*pLVar2 & 0xfffffff);
        lf_i = (size_t)(fullname + 0xff8);
        lf_dptr = (char *)((long)pDVar4 + (long)(int)(uint)(ushort)pLVar2[1]);
        for (lf_ii = 0; lf_ii < pLVar3; lf_ii = lf_ii + 1) {
          *(undefined1 *)lf_i = *(undefined1 *)((ulong)lf_dptr ^ 3);
          lf_i = lf_i + 1;
          lf_dptr = lf_dptr + 1;
        }
        (fullname + 0xff8)[(long)pLVar3] = '\0';
      }
      else if (*(char *)((long)pLVar2 + 6) == 'D') {
        pDVar4 = NativeAligned2FromLAddr(*pLVar2 & 0xfffffff);
        lf_length = (size_t)(pDVar4 + (int)(uint)(ushort)pLVar2[1]);
        lf_sbase = (short *)(fullname + 0xff8);
        for (lf_naddress = (LispPTR *)0x0; lf_naddress < pLVar3;
            lf_naddress = (LispPTR *)((long)lf_naddress + 1)) {
          *(char *)lf_sbase = (char)*(undefined2 *)(lf_length ^ 2);
          lf_length = lf_length + 2;
          lf_sbase = (short *)((long)lf_sbase + 1);
        }
        *(undefined1 *)lf_sbase = 0;
      }
      else {
        error("LispStringToCString: Not a character array.\n");
      }
      iVar1 = unixpathname(fullname + 0xff8,(char *)&len,0,0);
      if (iVar1 == 0) {
        args_local._4_4_ = 0;
      }
      else {
        alarm(TIMEOUT_TIME);
        do {
          piVar5 = __errno_location();
          *piVar5 = 0;
          iVar1 = stat((char *)&len,(stat *)&lf_arrayp);
          bVar6 = false;
          if (iVar1 == -1) {
            piVar5 = __errno_location();
            bVar6 = *piVar5 == 4;
          }
        } while (bVar6);
        alarm(0);
        if (iVar1 == -1) {
          piVar5 = __errno_location();
          *Lisp_errno = *piVar5;
          args_local._4_4_ = 0;
        }
        else if (((uint)sbuf.st_nlink & 0xf000) == 0x4000) {
          iVar1 = lisppathname((char *)&len,fullname + 0xff8,1,0);
          if (iVar1 == 0) {
            args_local._4_4_ = 0;
          }
          else {
            x = strlen(fullname + 0xff8);
            pLVar2 = NativeAligned4FromLAddr(args[1]);
            sbuf.__glibc_reserved[2] =
                 (__syscall_slong_t)NativeAligned2FromLAddr(*pLVar2 & 0xfffffff);
            lf_i_1 = sbuf.__glibc_reserved[2];
            lf_dptr_1 = fullname + 0xff8;
            for (local_2130 = 0; local_2130 < x + 1; local_2130 = local_2130 + 1) {
              *(char *)(lf_i_1 ^ 3) = *lf_dptr_1;
              lf_i_1 = lf_i_1 + 1;
              lf_dptr_1 = lf_dptr_1 + 1;
            }
            args_local._4_4_ = GetSmallp(x);
          }
        }
        else {
          args_local._4_4_ = 0;
        }
      }
    }
    else {
      *Lisp_errno = 200;
      args_local._4_4_ = 0;
    }
  }
  else {
    *Lisp_errno = 100;
    args_local._4_4_ = 0;
  }
  return args_local._4_4_;
}

Assistant:

LispPTR UFS_directorynamep(LispPTR *args)
{
  char dirname[MAXPATHLEN];
  char fullname[MAXPATHLEN];
  size_t len;
  int rval;
  char *base;
  struct stat sbuf;

  ERRSETJMP(NIL);
  Lisp_errno = (int *)(NativeAligned4FromLAddr(args[2]));

  LispStringLength(args[0], len, rval);
  len += 1;
  /* -2 for the initial and trail directory delimiter. */
  if (len > MAXPATHLEN - 2) FileNameTooLong(NIL);

  LispStringToCString(args[0], dirname, MAXPATHLEN);

/* Convert Xerox Lisp file naming convention to Unix one. */
#ifdef DOS
  if (unixpathname(dirname, fullname, 0, 0, 0, 0, 0) == 0) return (NIL);
#else
  if (unixpathname(dirname, fullname, 0, 0) == 0) return (NIL);
#endif /* DOS */

  TIMEOUT(rval = stat(fullname, &sbuf));
  if (rval == -1) {
    *Lisp_errno = errno;
    return (NIL);
  }

  if (!S_ISDIR(sbuf.st_mode)) return (NIL);

  /* Convert Unix file naming convention to Xerox Lisp one. */
  if (lisppathname(fullname, dirname, 1, 0) == 0) return (NIL);

  len = strlen(dirname);
  STRING_BASE(args[1], base);

#ifndef BYTESWAP
  strncpy(base, dirname, len + 1);
#else
  StrNCpyFromCToLisp(base, dirname, len + 1);
#endif /* BYTESWAP */

  return (GetSmallp(len));
}